

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.cc
# Opt level: O2

void __thiscall trng::mt19937::mt19937(mt19937 *this,unsigned_long s)

{
  memset(&this->S,0,0x9c4);
  seed(this,s);
  return;
}

Assistant:

mt19937::mt19937(unsigned long s) { seed(s); }